

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

void __thiscall
TEST_TestRegistry_runTwoTests_Test::~TEST_TestRegistry_runTwoTests_Test
          (TEST_TestRegistry_runTwoTests_Test *this)

{
  TEST_TestRegistry_runTwoTests_Test *this_local;
  
  ~TEST_TestRegistry_runTwoTests_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST(TestRegistry, runTwoTests)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    CHECK(!test1->hasRun_);
    CHECK(!test2->hasRun_);
    myRegistry->runAllTests(*result);
    CHECK(test1->hasRun_);
    CHECK(test2->hasRun_);
}